

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *pcVar1;
  string dir;
  string local_50;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pcVar1 = FindLastPathSeparator(this);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  else {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,(this->pathname_)._M_dataplus._M_p,pcVar1 + 1);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  FilePath(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}